

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-message.h
# Opt level: O2

Message * __thiscall testing::Message::operator<<(Message *this,char **pointer)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  ostream *os;
  
  pbVar1 = (this->ss_).ptr_;
  if (*pointer == (char *)0x0) {
    std::operator<<((ostream *)(pbVar1 + 0x10),"(null)");
  }
  else {
    os = (ostream *)(pbVar1 + 0x10);
    if (pbVar1 == (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      os = (ostream *)0x0;
    }
    GTestStreamToHelper<char_const*>(os,pointer);
  }
  return this;
}

Assistant:

inline Message& operator <<(T* const& pointer) {  // NOLINT
    if (pointer == NULL) {
      *ss_ << "(null)";
    } else {
      ::GTestStreamToHelper(ss_.get(), pointer);
    }
    return *this;
  }